

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkIoArrayConsistency
          (TParseContext *this,TSourceLoc *loc,int requiredSize,char *feature,TType *type,
          TString *name)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  TString *name_local;
  TType *type_local;
  char *feature_local;
  int requiredSize_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  uVar1 = (*type->_vptr_TType[0x1f])();
  if ((uVar1 & 1) == 0) {
    iVar2 = (*type->_vptr_TType[0xf])();
    if (iVar2 != requiredSize) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
        pcVar3 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (name);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"inconsistent input primitive for array size of",feature,pcVar3);
      }
      else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl)
      {
        pcVar3 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (name);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"inconsistent output number of vertices for array size of",feature,
                   pcVar3);
      }
      else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
        iVar2 = (*type->_vptr_TType[0xf])();
        if (requiredSize < iVar2) {
          pcVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (name);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc," cannot be greater than 3 for pervertexEXT",feature,pcVar3);
        }
      }
      else {
        if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                        ,0x371,
                        "void glslang::TParseContext::checkIoArrayConsistency(const TSourceLoc &, int, const char *, TType &, const TString &)"
                       );
        }
        pcVar3 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (name);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"inconsistent output array size of",feature,pcVar3);
      }
    }
  }
  else {
    TType::changeOuterArraySize(type,requiredSize);
  }
  return;
}

Assistant:

void TParseContext::checkIoArrayConsistency(const TSourceLoc& loc, int requiredSize, const char* feature, TType& type, const TString& name)
{
    if (type.isUnsizedArray())
        type.changeOuterArraySize(requiredSize);
    else if (type.getOuterArraySize() != requiredSize) {
        if (language == EShLangGeometry)
            error(loc, "inconsistent input primitive for array size of", feature, name.c_str());
        else if (language == EShLangTessControl)
            error(loc, "inconsistent output number of vertices for array size of", feature, name.c_str());
        else if (language == EShLangFragment) {
            if (type.getOuterArraySize() > requiredSize)
                error(loc, " cannot be greater than 3 for pervertexEXT", feature, name.c_str());
        }
        else if (language == EShLangMesh)
            error(loc, "inconsistent output array size of", feature, name.c_str());
        else
            assert(0);
    }
}